

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void r_object_collection(xr_packet *packet)

{
  uint __line;
  unsigned_short uVar1;
  
  uVar1 = xray_re::xr_packet::r<unsigned_short>(packet);
  if (uVar1 == 0) {
    uVar1 = xray_re::xr_packet::r<unsigned_short>(packet);
    if (uVar1 == 0) {
      uVar1 = xray_re::xr_packet::r<unsigned_short>(packet);
      if (uVar1 == 0) {
        uVar1 = xray_re::xr_packet::r<unsigned_short>(packet);
        if (uVar1 == 0) {
          return;
        }
        __line = 0x1e;
      }
      else {
        __line = 0x1c;
      }
    }
    else {
      __line = 0x1a;
    }
  }
  else {
    __line = 0x18;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                ,__line,"void r_object_collection(xr_packet &)");
}

Assistant:

static void r_object_collection(xr_packet& packet)
{
	if (packet.r_u16())		// m_count
		xr_not_implemented();
	if (packet.r_u16())		// m_last_id
		xr_not_implemented();
	if (packet.r_u16())		// m_free
		xr_not_implemented();
	if (packet.r_u16())		// m_given
		xr_not_implemented();
}